

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O1

int b_extract(lua_State *L)

{
  uint uVar1;
  ulong uVar2;
  int w;
  char local_1c [4];
  
  uVar2 = luaL_checkinteger(L,1);
  uVar1 = fieldargs(L,2,(int *)local_1c);
  lua_pushinteger(L,(ulong)(~(uint)(0x1fffffffe << ((ulong)(byte)(local_1c[0] - 1) & 0x3f)) &
                           (uint)((uVar2 & 0xffffffff) >> ((ulong)uVar1 & 0x3f))));
  return 1;
}

Assistant:

static int b_extract (lua_State *L) {
  int w;
  lua_Unsigned r = trim(checkunsigned(L, 1));
  int f = fieldargs(L, 2, &w);
  r = (r >> f) & mask(w);
  pushunsigned(L, r);
  return 1;
}